

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_bid_to_value_to_bid_test(btree_kv_ops *kv_ops)

{
  bid_t *pbVar1;
  bid_t bVar2;
  char *__format;
  bid_t bid1;
  timeval __test_begin;
  bid_t local_30;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  memleak_start();
  local_30 = 10;
  pbVar1 = (bid_t *)(*kv_ops->bid2value)(&local_30);
  if (*pbVar1 != local_30) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x362);
    kv_bid_to_value_to_bid_test(btree_kv_ops*)::__test_pass = '\x01';
    if (*pbVar1 != local_30) {
      __assert_fail("*(bid_t *)value == bid1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x362,"void kv_bid_to_value_to_bid_test(btree_kv_ops *)");
    }
  }
  bVar2 = (*kv_ops->value2bid)(pbVar1);
  if (bVar2 != local_30) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x366);
    kv_bid_to_value_to_bid_test(btree_kv_ops*)::__test_pass = '\x01';
    if (bVar2 != local_30) {
      __assert_fail("bid2 == bid1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x366,"void kv_bid_to_value_to_bid_test(btree_kv_ops *)");
    }
  }
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_bid_to_value_to_bid_test(btree_kv_ops*)::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv_bid_to_value_to_bid_test");
  return;
}

Assistant:

void kv_bid_to_value_to_bid_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    void *value;
    bid_t bid1, bid2;


    // bid to str value
    bid1 = 10;
    value = kv_ops->bid2value(&bid1);
    TEST_CHK( *(bid_t *)value == bid1 );

    // value to bid
    bid2 = kv_ops->value2bid(value);
    TEST_CHK( bid2 == bid1 );

    memleak_end();
    TEST_RESULT("kv_bid_to_value_to_bid_test");
}